

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::Optimize(Prog *this)

{
  Inst *ip;
  uint uVar1;
  Inst *pIVar2;
  Inst *pIVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  uint uVar8;
  Workq q;
  SparseSetT<void> local_58;
  
  SparseSetT<void>::SparseSetT(&local_58,this->size_);
  local_58.size_ = 0;
  AddToQueue(&local_58,this->start_);
  _Var7._M_head_impl =
       local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  do {
    if (_Var7._M_head_impl ==
        local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl + local_58.size_) {
      local_58.size_ = 0;
      AddToQueue(&local_58,this->start_);
      for (_Var7._M_head_impl =
                local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl;
          _Var7._M_head_impl !=
          local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl + local_58.size_;
          _Var7._M_head_impl = _Var7._M_head_impl + 1) {
        uVar1 = *_Var7._M_head_impl;
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        AddToQueue(&local_58,pIVar2[(int)uVar1].out_opcode_ >> 4);
        uVar8 = pIVar2[(int)uVar1].out_opcode_;
        if ((uVar8 & 7) == 0) {
          AddToQueue(&local_58,pIVar2[(int)uVar1].field_1.cap_);
          uVar8 = pIVar2[(int)uVar1].out_opcode_;
        }
        if ((uVar8 & 7) == 0) {
          pIVar3 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
          ip = pIVar3 + (uVar8 >> 4);
          pIVar3 = pIVar3 + pIVar2[(int)uVar1].field_1.cap_;
          if ((((((ip->out_opcode_ & 7) == 2) && (ip->out_opcode_ >> 4 == uVar1)) &&
               ((ip->field_1).field_3.lo_ == '\0')) &&
              (((ip->field_1).field_3.hi_ == 0xff && (bVar4 = IsMatch(this,pIVar3), bVar4)))) ||
             ((((bVar4 = IsMatch(this,ip), bVar4 &&
                (((pIVar3->out_opcode_ & 7) == 2 && (pIVar3->out_opcode_ >> 4 == uVar1)))) &&
               ((pIVar3->field_1).field_3.lo_ == '\0')) && ((pIVar3->field_1).field_3.hi_ == 0xff)))
             ) {
            pIVar2[(int)uVar1].out_opcode_ = uVar8 | 1;
          }
        }
      }
      SparseSetT<void>::~SparseSetT(&local_58);
      return;
    }
    uVar1 = *_Var7._M_head_impl;
    pIVar2 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar8 = pIVar2[(int)uVar1].out_opcode_;
    do {
      uVar5 = uVar8;
      if (uVar5 < 0x10) {
        uVar6 = 0;
        break;
      }
      uVar6 = uVar5 >> 4;
      uVar8 = pIVar2[uVar6].out_opcode_;
    } while ((pIVar2[uVar6].out_opcode_ & 7) == 6);
    pIVar2[(int)uVar1].out_opcode_ = pIVar2[(int)uVar1].out_opcode_ & 0xf | uVar5 & 0xfffffff0;
    AddToQueue(&local_58,uVar6);
    if ((pIVar2[(int)uVar1].out_opcode_ & 7) == 0) {
      uVar8 = pIVar2[(int)uVar1].field_1.cap_;
      do {
        uVar5 = uVar8;
        if (uVar5 == 0) break;
        uVar6 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl[(int)uVar5].out_opcode_
        ;
        uVar8 = uVar6 >> 4;
      } while ((uVar6 & 7) == 6);
      pIVar2[(int)uVar1].field_1.cap_ = uVar5;
      AddToQueue(&local_58,uVar5);
    }
    _Var7._M_head_impl = _Var7._M_head_impl + 1;
  } while( true );
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}